

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O2

ES5ArrayTypeHandlerBase<unsigned_short> * __thiscall
Js::DictionaryTypeHandlerBase<unsigned_short>::ConvertToES5ArrayType
          (DictionaryTypeHandlerBase<unsigned_short> *this,DynamicObject *instance)

{
  code *pcVar1;
  bool bVar2;
  Recycler *this_00;
  Recycler *alloc;
  ES5ArrayTypeHandlerBase<unsigned_short> *this_01;
  undefined4 *puVar3;
  undefined1 local_50 [8];
  TrackAllocData data;
  
  this_00 = RecyclableObject::GetRecycler(&instance->super_RecyclableObject);
  local_50 = (undefined1  [8])&ES5ArrayTypeHandlerBase<unsigned_short>::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_97ce4e0;
  data.filename._0_4_ = 0x8d3;
  alloc = Memory::Recycler::TrackAllocInfo(this_00,(TrackAllocData *)local_50);
  this_01 = (ES5ArrayTypeHandlerBase<unsigned_short> *)new<Memory::Recycler>(0x40,alloc,0x37a1d4);
  ES5ArrayTypeHandlerBase<unsigned_short>::ES5ArrayTypeHandlerBase(this_01,this_00,this);
  if (((this_01->super_DictionaryTypeHandlerBase<unsigned_short>).super_DynamicTypeHandler.flags &
      0x20) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x8d5,"((newTypeHandler->GetFlags() & IsPrototypeFlag) == 0)",
                                "Why did we create a brand new type handler with a prototype flag set?"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  DynamicTypeHandler::SetFlags
            ((DynamicTypeHandler *)this_01,(this->super_DynamicTypeHandler).flags & 0x20);
  ES5ArrayTypeHandlerBase<unsigned_short>::SetInstanceTypeHandler(this_01,instance,true);
  return this_01;
}

Assistant:

ES5ArrayTypeHandlerBase<T>* DictionaryTypeHandlerBase<T>::ConvertToES5ArrayType(DynamicObject *instance)
    {
        Recycler* recycler = instance->GetRecycler();

        ES5ArrayTypeHandlerBase<T>* newTypeHandler = RecyclerNew(recycler, ES5ArrayTypeHandlerBase<T>, recycler, this);
        // Don't need to transfer the singleton instance, because the new handler takes over this handler.
        AssertMsg((newTypeHandler->GetFlags() & IsPrototypeFlag) == 0, "Why did we create a brand new type handler with a prototype flag set?");
        newTypeHandler->SetFlags(IsPrototypeFlag, this->GetFlags());
        // Property types were copied in the constructor.
        //newTypeHandler->SetPropertyTypes(PropertyTypesWritableDataOnly | PropertyTypesWritableDataOnlyDetection | PropertyTypesInlineSlotCapacityLocked, this->GetPropertyTypes());
        newTypeHandler->SetInstanceTypeHandler(instance);
        return newTypeHandler;
    }